

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O1

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::complete_store_message_to_queue
          (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
           *this,deliver_op_tracer *tracer,type_index *msg_type,message_ref_t *message,
          invocation_type_t demand_type)

{
  atomic_refcounted_t *paVar1;
  _Elt_pointer pdVar2;
  _Elt_pointer pdVar3;
  undefined8 *puVar4;
  select_case_t *psVar5;
  _Map_pointer ppdVar6;
  select_case_t *psVar7;
  demand_t local_38;
  
  pdVar2 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pdVar3 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_38.m_msg_type = (type_index)msg_type->_M_target;
  local_38.m_message_ref = (message_ref_t)message->m_obj;
  if (local_38.m_message_ref.m_obj != (message_t *)0x0) {
    LOCK();
    ((local_38.m_message_ref.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         ((local_38.m_message_ref.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  local_38.m_demand_type = demand_type;
  std::deque<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>::
  emplace_back<so_5::mchain_props::demand_t>(&(this->m_queue).m_queue,&local_38);
  if (local_38.m_message_ref.m_obj != (message_t *)0x0) {
    LOCK();
    paVar1 = &(local_38.m_message_ref.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_38.m_message_ref.m_obj != (message_t *)0x0)) {
      (*(local_38.m_message_ref.m_obj)->_vptr_message_t[1])();
    }
    local_38.m_message_ref.m_obj = (message_t *)0x0;
  }
  if (pdVar3 == pdVar2) {
    if ((this->m_not_empty_notificator).super__Function_base._M_manager != (_Manager_type)0x0) {
      so_5::details::
      invoke_noexcept_code<so_5::mchain_props::mchain_template<so_5::mchain_props::details::unlimited_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>::complete_store_message_to_queue(so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base::deliver_op_tracer&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                ((anon_class_8_1_8991fb9c)this);
    }
    psVar7 = this->m_select_tail;
    if (psVar7 != (select_case_t *)0x0) {
      this->m_select_tail = (select_case_t *)0x0;
      do {
        puVar4 = *(undefined8 **)(psVar7 + 0x10);
        psVar5 = *(select_case_t **)(psVar7 + 0x18);
        *(undefined8 *)(psVar7 + 0x10) = 0;
        *(undefined8 *)(psVar7 + 0x18) = 0;
        (**(code **)*puVar4)();
        psVar7 = psVar5;
      } while (psVar5 != (select_case_t *)0x0);
    }
  }
  if ((this->m_threads_to_wakeup != 0) &&
     (ppdVar6 = (this->m_queue).m_queue.
                super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,
     ((long)(this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last -
      (long)(this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
     ((long)(this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
      (long)(this->m_queue).m_queue.
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
     (((long)ppdVar6 -
       (long)(this->m_queue).m_queue.
             super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
     (ulong)(ppdVar6 == (_Map_pointer)0x0)) * 0x15 <= this->m_threads_to_wakeup)) {
    std::condition_variable::notify_one();
  }
  return;
}

Assistant:

void
		complete_store_message_to_queue(
			typename TRACING_BASE::deliver_op_tracer & tracer,
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				const bool was_empty = m_queue.is_empty();
				
				m_queue.push_back(
						demand_t{ msg_type, message, demand_type } );

				tracer.stored( m_queue );

				// If chain was empty then multi-chain cases must be notified.
				// And if not_empty_notificator is defined then it must be used too.
				if( was_empty )
					{
						if( m_not_empty_notificator )
							so_5::details::invoke_noexcept_code(
								[this] { m_not_empty_notificator(); } );

						notify_multi_chain_select_ops();
					}

				// Should be wake up some sleeping thread?
				if( m_threads_to_wakeup && m_threads_to_wakeup >= m_queue.size() )
					// Someone is waiting on empty queue.
					m_underflow_cond.notify_one();
			}